

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::local_time(spec *s)

{
  long in_RSI;
  sequence *in_RDI;
  sequence *time;
  undefined7 in_stack_fffffffffffffd88;
  char_type in_stack_fffffffffffffd8f;
  sequence *in_stack_fffffffffffffd90;
  sequence *psVar1;
  sequence *in_stack_fffffffffffffd98;
  sequence *psVar2;
  repeat_at_least *in_stack_fffffffffffffda0;
  repeat_at_least *args_1;
  repeat_exact *in_stack_fffffffffffffda8;
  maybe *args_2;
  sequence *in_stack_fffffffffffffdb0;
  repeat_exact *args;
  sequence local_228 [3];
  sequence local_1b8;
  undefined1 local_188 [128];
  sequence local_108 [3];
  repeat_exact local_98 [5];
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  psVar1 = in_RDI;
  local_10 = in_RSI;
  digit::digit((digit *)in_stack_fffffffffffffd90,
               (spec *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            ((repeat_exact *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
             (digit *)in_stack_fffffffffffffda0);
  character::character((character *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
  args = local_98;
  digit::digit((digit *)in_stack_fffffffffffffd90,
               (spec *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            ((repeat_exact *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
             (digit *)in_stack_fffffffffffffda0);
  sequence::sequence<toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (psVar1,args,(character *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffd90);
  digit::~digit((digit *)in_stack_fffffffffffffd90);
  character::~character((character *)0x67920f);
  repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffd90);
  digit::~digit((digit *)in_stack_fffffffffffffd90);
  if ((*(byte *)(local_10 + 0x12) & 1) == 0) {
    args_1 = (repeat_at_least *)local_188;
    character::character((character *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    sequence::push_back<toml::detail::character>
              (in_stack_fffffffffffffd90,
               (character *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    character::~character((character *)0x6795b7);
    psVar2 = &local_1b8;
    digit::digit((digit *)in_stack_fffffffffffffd90,
                 (spec *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    repeat_exact::repeat_exact<toml::detail::syntax::digit>
              ((repeat_exact *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
               (digit *)args_1);
    sequence::push_back<toml::detail::repeat_exact>
              (in_stack_fffffffffffffd90,
               (repeat_exact *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffd90);
    digit::~digit((digit *)in_stack_fffffffffffffd90);
    character::character((character *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    psVar1 = local_228;
    digit::digit((digit *)psVar1,
                 (spec *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    repeat_at_least::repeat_at_least<toml::detail::syntax::digit>
              ((repeat_at_least *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
               (digit *)args_1);
    sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
              (in_stack_fffffffffffffdb0,(character *)in_stack_fffffffffffffda8,args_1);
    maybe::maybe<toml::detail::sequence>((maybe *)args_1,psVar2);
    sequence::push_back<toml::detail::maybe>
              (psVar1,(maybe *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    maybe::~maybe((maybe *)psVar1);
    sequence::~sequence(psVar1);
    repeat_at_least::~repeat_at_least((repeat_at_least *)psVar1);
    digit::~digit((digit *)psVar1);
    character::~character((character *)0x6796d9);
  }
  else {
    character::character((character *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    psVar2 = local_108;
    digit::digit((digit *)in_stack_fffffffffffffd90,
                 (spec *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    repeat_exact::repeat_exact<toml::detail::syntax::digit>
              ((repeat_exact *)psVar2,(size_t)in_stack_fffffffffffffda8,
               (digit *)in_stack_fffffffffffffda0);
    character::character((character *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    args_2 = (maybe *)(local_188 + 0x10);
    digit::digit((digit *)in_stack_fffffffffffffd90,
                 (spec *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    repeat_at_least::repeat_at_least<toml::detail::syntax::digit>
              ((repeat_at_least *)psVar2,(size_t)args_2,(digit *)in_stack_fffffffffffffda0);
    sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
              (psVar2,(character *)args_2,in_stack_fffffffffffffda0);
    maybe::maybe<toml::detail::sequence>
              ((maybe *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    sequence::sequence<toml::detail::character,toml::detail::repeat_exact,toml::detail::maybe>
              (psVar1,(character *)args,(repeat_exact *)psVar2,args_2);
    maybe::maybe<toml::detail::sequence>
              ((maybe *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    sequence::push_back<toml::detail::maybe>
              (in_stack_fffffffffffffd90,
               (maybe *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    maybe::~maybe((maybe *)in_stack_fffffffffffffd90);
    sequence::~sequence(in_stack_fffffffffffffd90);
    maybe::~maybe((maybe *)in_stack_fffffffffffffd90);
    sequence::~sequence(in_stack_fffffffffffffd90);
    repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffd90);
    digit::~digit((digit *)in_stack_fffffffffffffd90);
    character::~character((character *)0x6793a8);
    repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffd90);
    digit::~digit((digit *)in_stack_fffffffffffffd90);
    character::~character((character *)0x6793cf);
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence local_time(const spec& s)
{
    auto time = sequence(
            repeat_exact(2, digit(s)),
            character(':'),
            repeat_exact(2, digit(s))
        );

    if(s.v1_1_0_make_seconds_optional)
    {
        time.push_back(maybe(sequence(
                character(':'),
                repeat_exact(2, digit(s)),
                maybe(sequence(character('.'), repeat_at_least(1, digit(s))))
            )));
    }
    else
    {
        time.push_back(character(':'));
        time.push_back(repeat_exact(2, digit(s)));
        time.push_back(
            maybe(sequence(character('.'), repeat_at_least(1, digit(s))))
        );
    }

    return time;
}